

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

TEdge * __thiscall ClipperLib::ClipperBase::AddBoundsToLML(ClipperBase *this,TEdge *e)

{
  double dVar1;
  long lVar2;
  long64 lVar3;
  long lVar4;
  LocalMinima *pLVar5;
  LocalMinima *pLVar6;
  LocalMinima *pLVar7;
  LocalMinima **ppLVar8;
  TEdge *pTVar9;
  double dVar10;
  
  pTVar9 = (TEdge *)0x0;
  do {
    while( true ) {
      e->nextInLML = pTVar9;
      e = e->next;
      dVar1 = e->dx;
      dVar10 = ABS(dVar1 + 1e+40);
      if (1e-20 <= dVar10) break;
      if (e->next->ytop < e->ytop) {
        pTVar9 = e->prev;
        lVar4 = pTVar9->xbot;
        if (lVar4 < e->next->xbot) goto LAB_00605d93;
      }
      else {
        pTVar9 = e->prev;
        lVar4 = pTVar9->xbot;
      }
      lVar2 = e->xtop;
      if (lVar2 != lVar4) {
        e->xcurr = lVar2;
        e->xtop = e->xbot;
        e->xbot = lVar2;
      }
    }
    pTVar9 = e->prev;
  } while (e->ycurr != pTVar9->ycurr);
LAB_00605d93:
  pLVar5 = (LocalMinima *)operator_new(0x20);
  pLVar5->next = (LocalMinima *)0x0;
  pLVar5->Y = pTVar9->ybot;
  if (1e-20 <= dVar10) {
    if (pTVar9->dx <= dVar1) {
      pLVar5->leftBound = e;
      pLVar5->rightBound = pTVar9;
      pTVar9 = e;
      goto LAB_00605e04;
    }
  }
  else if (e->xbot != pTVar9->xbot) {
    lVar3 = e->xtop;
    e->xcurr = lVar3;
    e->xtop = e->xbot;
    e->xbot = lVar3;
  }
  pLVar5->leftBound = pTVar9;
  pLVar5->rightBound = e;
LAB_00605e04:
  pTVar9->side = esLeft;
  pLVar5->rightBound->side = esRight;
  pLVar7 = this->m_MinimaList;
  ppLVar8 = &this->m_MinimaList;
  if (pLVar7 != (LocalMinima *)0x0) {
    if (pLVar5->Y < pLVar7->Y) {
      do {
        pLVar6 = pLVar7;
        pLVar7 = pLVar6->next;
        if (pLVar7 == (LocalMinima *)0x0) {
          pLVar7 = (LocalMinima *)0x0;
          break;
        }
      } while (pLVar5->Y < pLVar7->Y);
      ppLVar8 = &pLVar6->next;
    }
    pLVar5->next = pLVar7;
  }
  *ppLVar8 = pLVar5;
  while( true ) {
    pTVar9 = e->next;
    if ((pTVar9->ytop == e->ytop) && (1e-20 <= ABS(pTVar9->dx + 1e+40))) break;
    e->nextInLML = pTVar9;
    e = pTVar9;
    if ((ABS(pTVar9->dx + 1e+40) < 1e-20) && (pTVar9->xbot != pTVar9->prev->xtop)) {
      lVar3 = pTVar9->xtop;
      pTVar9->xcurr = lVar3;
      pTVar9->xtop = pTVar9->xbot;
      pTVar9->xbot = lVar3;
    }
  }
  return pTVar9;
}

Assistant:

TEdge* ClipperBase::AddBoundsToLML(TEdge *e)
{
  //Starting at the top of one bound we progress to the bottom where there's
  //a local minima. We then go to the top of the next bound. These two bounds
  //form the left and right (or right and left) bounds of the local minima.
  e->nextInLML = 0;
  e = e->next;
  for (;;)
  {
    if (NEAR_EQUAL(e->dx, HORIZONTAL))
    {
      //nb: proceed through horizontals when approaching from their right,
      //    but break on horizontal minima if approaching from their left.
      //    This ensures 'local minima' are always on the left of horizontals.
      if (e->next->ytop < e->ytop && e->next->xbot > e->prev->xbot) break;
      if (e->xtop != e->prev->xbot) SwapX(*e);
      e->nextInLML = e->prev;
    }
    else if (e->ycurr == e->prev->ycurr) break;
    else e->nextInLML = e->prev;
    e = e->next;
  }

  //e and e.prev are now at a local minima ...
  LocalMinima* newLm = new LocalMinima;
  newLm->next = 0;
  newLm->Y = e->prev->ybot;

  if ( NEAR_EQUAL(e->dx, HORIZONTAL) ) //horizontal edges never start a left bound
  {
    if (e->xbot != e->prev->xbot) SwapX(*e);
    newLm->leftBound = e->prev;
    newLm->rightBound = e;
  } else if (e->dx < e->prev->dx)
  {
    newLm->leftBound = e->prev;
    newLm->rightBound = e;
  } else
  {
    newLm->leftBound = e;
    newLm->rightBound = e->prev;
  }
  newLm->leftBound->side = esLeft;
  newLm->rightBound->side = esRight;
  InsertLocalMinima( newLm );

  for (;;)
  {
    if ( e->next->ytop == e->ytop && !NEAR_EQUAL(e->next->dx, HORIZONTAL) ) break;
    e->nextInLML = e->next;
    e = e->next;
    if ( NEAR_EQUAL(e->dx, HORIZONTAL) && e->xbot != e->prev->xtop) SwapX(*e);
  }
  return e->next;
}